

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

void __thiscall wasm::StackIROptimizer::removeUnneededBlocks(StackIROptimizer *this)

{
  pointer ppSVar1;
  Expression *this_00;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  Resume *pRVar4;
  Break *pBVar5;
  TryTable *pTVar6;
  Try *pTVar7;
  Switch *pSVar8;
  BrOn *pBVar9;
  ResumeThrow *pRVar10;
  Name *pNVar11;
  size_type sVar12;
  uint uVar13;
  pointer ppSVar14;
  StackInst **inst;
  _Hash_node_base *p_Var15;
  undefined1 local_70 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  targets;
  
  local_70 = (undefined1  [8])&targets._M_h._M_rehash_policy._M_next_resize;
  targets._M_h._M_buckets = (__buckets_ptr)0x1;
  targets._M_h._M_bucket_count = 0;
  targets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  targets._M_h._M_element_count._0_4_ = 0x3f800000;
  targets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  targets._M_h._M_rehash_policy._4_4_ = 0;
  targets._M_h._M_rehash_policy._M_next_resize = 0;
  ppSVar14 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  targets._M_h._M_single_bucket = (__node_base_ptr)this;
  do {
    if (ppSVar14 == ppSVar1) {
      p_Var2 = targets._M_h._M_single_bucket[1]._M_nxt[1]._M_nxt;
      for (p_Var15 = (targets._M_h._M_single_bucket[1]._M_nxt)->_M_nxt; p_Var15 != p_Var2;
          p_Var15 = p_Var15 + 1) {
        if (((p_Var15->_M_nxt != (_Hash_node_base *)0x0) &&
            (p_Var3 = p_Var15->_M_nxt[1]._M_nxt, *(char *)&p_Var3->_M_nxt == '\x01')) &&
           ((p_Var3[3]._M_nxt == (_Hash_node_base *)0x0 ||
            (sVar12 = std::
                      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)local_70,(key_type *)(p_Var3 + 2)), sVar12 == 0)))) {
          p_Var15->_M_nxt = (_Hash_node_base *)0x0;
        }
      }
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_70);
      return;
    }
    if (*ppSVar14 == (StackInst *)0x0) goto switchD_00cf82fd_default;
    this_00 = (*ppSVar14)->origin;
    switch(this_00->_id) {
    case InvalidId:
    case NumExpressionIds:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                         ,0x103);
    case BlockId:
      Expression::cast<wasm::Block>(this_00);
      break;
    case IfId:
      Expression::cast<wasm::If>(this_00);
      break;
    case LoopId:
      Expression::cast<wasm::Loop>(this_00);
      break;
    case BreakId:
      pBVar5 = Expression::cast<wasm::Break>(this_00);
      goto LAB_00cf8568;
    case SwitchId:
      pSVar8 = Expression::cast<wasm::Switch>(this_00);
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_70,&pSVar8->default_);
      for (uVar13 = 0;
          (ulong)uVar13 <
          (pSVar8->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
          uVar13 = uVar13 + 1) {
        pNVar11 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pSVar8->targets).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)uVar13);
        std::__detail::
        _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_70,pNVar11);
      }
      break;
    case CallId:
      Expression::cast<wasm::Call>(this_00);
      break;
    case CallIndirectId:
      Expression::cast<wasm::CallIndirect>(this_00);
      break;
    case LocalGetId:
      Expression::cast<wasm::LocalGet>(this_00);
      break;
    case LocalSetId:
      Expression::cast<wasm::LocalSet>(this_00);
      break;
    case GlobalGetId:
      Expression::cast<wasm::GlobalGet>(this_00);
      break;
    case GlobalSetId:
      Expression::cast<wasm::GlobalSet>(this_00);
      break;
    case LoadId:
      Expression::cast<wasm::Load>(this_00);
      break;
    case StoreId:
      Expression::cast<wasm::Store>(this_00);
      break;
    case ConstId:
      Expression::cast<wasm::Const>(this_00);
      break;
    case UnaryId:
      Expression::cast<wasm::Unary>(this_00);
      break;
    case BinaryId:
      Expression::cast<wasm::Binary>(this_00);
      break;
    case SelectId:
      Expression::cast<wasm::Select>(this_00);
      break;
    case DropId:
      Expression::cast<wasm::Drop>(this_00);
      break;
    case ReturnId:
      Expression::cast<wasm::Return>(this_00);
      break;
    case MemorySizeId:
      Expression::cast<wasm::MemorySize>(this_00);
      break;
    case MemoryGrowId:
      Expression::cast<wasm::MemoryGrow>(this_00);
      break;
    case NopId:
      Expression::cast<wasm::Nop>(this_00);
      break;
    case UnreachableId:
      Expression::cast<wasm::Unreachable>(this_00);
      break;
    case AtomicRMWId:
      Expression::cast<wasm::AtomicRMW>(this_00);
      break;
    case AtomicCmpxchgId:
      Expression::cast<wasm::AtomicCmpxchg>(this_00);
      break;
    case AtomicWaitId:
      Expression::cast<wasm::AtomicWait>(this_00);
      break;
    case AtomicNotifyId:
      Expression::cast<wasm::AtomicNotify>(this_00);
      break;
    case AtomicFenceId:
      Expression::cast<wasm::AtomicFence>(this_00);
      break;
    case SIMDExtractId:
      Expression::cast<wasm::SIMDExtract>(this_00);
      break;
    case SIMDReplaceId:
      Expression::cast<wasm::SIMDReplace>(this_00);
      break;
    case SIMDShuffleId:
      Expression::cast<wasm::SIMDShuffle>(this_00);
      break;
    case SIMDTernaryId:
      Expression::cast<wasm::SIMDTernary>(this_00);
      break;
    case SIMDShiftId:
      Expression::cast<wasm::SIMDShift>(this_00);
      break;
    case SIMDLoadId:
      Expression::cast<wasm::SIMDLoad>(this_00);
      break;
    case SIMDLoadStoreLaneId:
      Expression::cast<wasm::SIMDLoadStoreLane>(this_00);
      break;
    case MemoryInitId:
      Expression::cast<wasm::MemoryInit>(this_00);
      break;
    case DataDropId:
      Expression::cast<wasm::DataDrop>(this_00);
      break;
    case MemoryCopyId:
      Expression::cast<wasm::MemoryCopy>(this_00);
      break;
    case MemoryFillId:
      Expression::cast<wasm::MemoryFill>(this_00);
      break;
    case PopId:
      Expression::cast<wasm::Pop>(this_00);
      break;
    case RefNullId:
      Expression::cast<wasm::RefNull>(this_00);
      break;
    case RefIsNullId:
      Expression::cast<wasm::RefIsNull>(this_00);
      break;
    case RefFuncId:
      Expression::cast<wasm::RefFunc>(this_00);
      break;
    case RefEqId:
      Expression::cast<wasm::RefEq>(this_00);
      break;
    case TableGetId:
      Expression::cast<wasm::TableGet>(this_00);
      break;
    case TableSetId:
      Expression::cast<wasm::TableSet>(this_00);
      break;
    case TableSizeId:
      Expression::cast<wasm::TableSize>(this_00);
      break;
    case TableGrowId:
      Expression::cast<wasm::TableGrow>(this_00);
      break;
    case TableFillId:
      Expression::cast<wasm::TableFill>(this_00);
      break;
    case TableCopyId:
      Expression::cast<wasm::TableCopy>(this_00);
      break;
    case TableInitId:
      Expression::cast<wasm::TableInit>(this_00);
      break;
    case TryId:
      pTVar7 = Expression::cast<wasm::Try>(this_00);
      pNVar11 = &pTVar7->delegateTarget;
      goto LAB_00cf864e;
    case TryTableId:
      pTVar6 = Expression::cast<wasm::TryTable>(this_00);
      for (uVar13 = 0;
          (ulong)uVar13 <
          (pTVar6->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements; uVar13 = uVar13 + 1) {
        pNVar11 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pTVar6->catchDests).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)uVar13);
        std::__detail::
        _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_70,pNVar11);
      }
      break;
    case ThrowId:
      Expression::cast<wasm::Throw>(this_00);
      break;
    case RethrowId:
      pBVar5 = (Break *)Expression::cast<wasm::Rethrow>(this_00);
LAB_00cf8568:
      pNVar11 = &pBVar5->name;
      goto LAB_00cf864e;
    case ThrowRefId:
      Expression::cast<wasm::ThrowRef>(this_00);
      break;
    case TupleMakeId:
      Expression::cast<wasm::TupleMake>(this_00);
      break;
    case TupleExtractId:
      Expression::cast<wasm::TupleExtract>(this_00);
      break;
    case RefI31Id:
      Expression::cast<wasm::RefI31>(this_00);
      break;
    case I31GetId:
      Expression::cast<wasm::I31Get>(this_00);
      break;
    case CallRefId:
      Expression::cast<wasm::CallRef>(this_00);
      break;
    case RefTestId:
      Expression::cast<wasm::RefTest>(this_00);
      break;
    case RefCastId:
      Expression::cast<wasm::RefCast>(this_00);
      break;
    case BrOnId:
      pBVar9 = Expression::cast<wasm::BrOn>(this_00);
      pNVar11 = &pBVar9->name;
LAB_00cf864e:
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_70,pNVar11);
      break;
    case StructNewId:
      Expression::cast<wasm::StructNew>(this_00);
      break;
    case StructGetId:
      Expression::cast<wasm::StructGet>(this_00);
      break;
    case StructSetId:
      Expression::cast<wasm::StructSet>(this_00);
      break;
    case StructRMWId:
      Expression::cast<wasm::StructRMW>(this_00);
      break;
    case StructCmpxchgId:
      Expression::cast<wasm::StructCmpxchg>(this_00);
      break;
    case ArrayNewId:
      Expression::cast<wasm::ArrayNew>(this_00);
      break;
    case ArrayNewDataId:
      Expression::cast<wasm::ArrayNewData>(this_00);
      break;
    case ArrayNewElemId:
      Expression::cast<wasm::ArrayNewElem>(this_00);
      break;
    case ArrayNewFixedId:
      Expression::cast<wasm::ArrayNewFixed>(this_00);
      break;
    case ArrayGetId:
      Expression::cast<wasm::ArrayGet>(this_00);
      break;
    case ArraySetId:
      Expression::cast<wasm::ArraySet>(this_00);
      break;
    case ArrayLenId:
      Expression::cast<wasm::ArrayLen>(this_00);
      break;
    case ArrayCopyId:
      Expression::cast<wasm::ArrayCopy>(this_00);
      break;
    case ArrayFillId:
      Expression::cast<wasm::ArrayFill>(this_00);
      break;
    case ArrayInitDataId:
      Expression::cast<wasm::ArrayInitData>(this_00);
      break;
    case ArrayInitElemId:
      Expression::cast<wasm::ArrayInitElem>(this_00);
      break;
    case RefAsId:
      Expression::cast<wasm::RefAs>(this_00);
      break;
    case StringNewId:
      Expression::cast<wasm::StringNew>(this_00);
      break;
    case StringConstId:
      Expression::cast<wasm::StringConst>(this_00);
      break;
    case StringMeasureId:
      Expression::cast<wasm::StringMeasure>(this_00);
      break;
    case StringEncodeId:
      Expression::cast<wasm::StringEncode>(this_00);
      break;
    case StringConcatId:
      Expression::cast<wasm::StringConcat>(this_00);
      break;
    case StringEqId:
      Expression::cast<wasm::StringEq>(this_00);
      break;
    case StringWTF16GetId:
      Expression::cast<wasm::StringWTF16Get>(this_00);
      break;
    case StringSliceWTFId:
      Expression::cast<wasm::StringSliceWTF>(this_00);
      break;
    case ContNewId:
      Expression::cast<wasm::ContNew>(this_00);
      break;
    case ContBindId:
      Expression::cast<wasm::ContBind>(this_00);
      break;
    case SuspendId:
      Expression::cast<wasm::Suspend>(this_00);
      break;
    case ResumeId:
      pRVar4 = Expression::cast<wasm::Resume>(this_00);
      for (uVar13 = 0;
          (ulong)uVar13 <
          (pRVar4->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements; uVar13 = uVar13 + 1) {
        pNVar11 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pRVar4->handlerBlocks).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)uVar13);
        std::__detail::
        _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_70,pNVar11);
      }
      break;
    case ResumeThrowId:
      pRVar10 = Expression::cast<wasm::ResumeThrow>(this_00);
      for (uVar13 = 0;
          (ulong)uVar13 <
          (pRVar10->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements; uVar13 = uVar13 + 1) {
        pNVar11 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pRVar10->handlerBlocks).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)uVar13);
        std::__detail::
        _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_70,pNVar11);
      }
      break;
    case StackSwitchId:
      Expression::cast<wasm::StackSwitch>(this_00);
    }
switchD_00cf82fd_default:
    ppSVar14 = ppSVar14 + 1;
  } while( true );
}

Assistant:

void StackIROptimizer::removeUnneededBlocks() {
  // First, find all branch targets.
  std::unordered_set<Name> targets;
  for (auto*& inst : insts) {
    if (inst) {
      BranchUtils::operateOnScopeNameUses(
        inst->origin, [&](Name& name) { targets.insert(name); });
    }
  }

  // Remove untargeted blocks.
  for (auto*& inst : insts) {
    if (!inst) {
      continue;
    }
    if (auto* block = inst->origin->dynCast<Block>()) {
      if (!block->name.is() || !targets.count(block->name)) {
        // TODO optimize, maybe run remove-unused-names
        inst = nullptr;
      }
    }
  }
}